

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-object.c
# Opt level: O0

void set_obj_names(_Bool terse,player *p)

{
  object *obj_00;
  size_t sVar1;
  int iVar2;
  size_t sVar3;
  size_t sVar4;
  size_t sVar5;
  size_t local_48;
  object *obj;
  wchar_t i;
  player *p_local;
  _Bool terse_local;
  
  for (obj._4_4_ = L'\0'; obj._4_4_ < num_obj; obj._4_4_ = obj._4_4_ + L'\x01') {
    obj_00 = items[obj._4_4_].object;
    if (obj_00 == (object *)0x0) {
      if ((obj._4_4_ < num_head) || (iVar2 = strcmp(items[obj._4_4_].label,"In quiver"), iVar2 == 0)
         ) {
        strnfmt(items[obj._4_4_].o_name,0x50,"%s","");
      }
      else {
        strnfmt(items[obj._4_4_].o_name,0x50,"(nothing)");
      }
    }
    else if (terse) {
      object_desc(items[obj._4_4_].o_name,0x50,obj_00,0x143,p);
    }
    else {
      object_desc(items[obj._4_4_].o_name,0x50,obj_00,0x43,p);
    }
    sVar1 = max_len;
    sVar3 = strlen(items[obj._4_4_].label);
    sVar4 = strlen(items[obj._4_4_].equip_label);
    sVar5 = strlen(items[obj._4_4_].o_name);
    if (sVar1 < sVar3 + sVar4 + sVar5) {
      sVar3 = strlen(items[obj._4_4_].label);
      sVar4 = strlen(items[obj._4_4_].equip_label);
      sVar5 = strlen(items[obj._4_4_].o_name);
      local_48 = sVar3 + sVar4 + sVar5;
    }
    else {
      local_48 = max_len;
    }
    max_len = local_48;
  }
  return;
}

Assistant:

static void set_obj_names(bool terse, const struct player *p)
{
	int i;
	struct object *obj;

	/* Calculate name offset and max name length */
	for (i = 0; i < num_obj; i++) {
		obj = items[i].object;

		/* Null objects are used to skip lines, or display only a label */		
		if (!obj) {
			if ((i < num_head) || streq(items[i].label, "In quiver"))
				strnfmt(items[i].o_name, sizeof(items[i].o_name), "%s", "");
			else
				strnfmt(items[i].o_name, sizeof(items[i].o_name), "(nothing)");
		} else {
			if (terse) {
				object_desc(items[i].o_name,
					sizeof(items[i].o_name), obj,
					ODESC_PREFIX | ODESC_FULL | ODESC_TERSE,
					p);
			} else {
				object_desc(items[i].o_name,
					sizeof(items[i].o_name), obj,
					ODESC_PREFIX | ODESC_FULL, p);
			}
		}

		/* Max length of label + object name */
		max_len = MAX(max_len,
					  strlen(items[i].label) + strlen(items[i].equip_label) +
					  strlen(items[i].o_name));
	}
}